

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

int CBS_parse_rfc5280_time_internal(CBS *cbs,int is_gentime,int allow_timezone_offset,tm *out_tm)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int tmp;
  CBS copy;
  int offset_minutes;
  int day;
  int offset_hours;
  int sec;
  int min;
  int hour;
  int month;
  
  copy.data = cbs->data;
  copy.len = cbs->len;
  iVar3 = cbs_get_two_digits(&copy,&tmp);
  iVar4 = tmp;
  if (is_gentime == 0) {
    if (iVar3 == 0) {
      return 0;
    }
    uVar6 = tmp + 2000;
    if (0x31 < tmp) {
      uVar6 = tmp + 0x76c;
    }
    if (0x801 < (int)uVar6) {
      return 0;
    }
  }
  else {
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = cbs_get_two_digits(&copy,&tmp);
    if (iVar3 == 0) {
      return 0;
    }
    uVar6 = iVar4 * 100 + tmp;
  }
  iVar4 = cbs_get_two_digits(&copy,&month);
  if (month - 0xdU < 0xfffffff4 || iVar4 == 0) {
    return 0;
  }
  iVar4 = cbs_get_two_digits(&copy,&day);
  if (iVar4 == 0) {
    return 0;
  }
  if (day < 1) {
    return 0;
  }
  if ((0x15aaU >> (month & 0x1fU) & 1) == 0) {
    if ((0xa50U >> (month & 0x1fU) & 1) == 0) {
      if (((int)uVar6 % 400 == 0) || ((uVar6 & 3) == 0 && (int)uVar6 % 100 != 0)) {
        if (0x1d < (uint)day) {
          return 0;
        }
      }
      else if (0x1c < (uint)day) {
        return 0;
      }
    }
    else if (0x1e < (uint)day) {
      return 0;
    }
  }
  else if (0x1f < (uint)day) {
    return 0;
  }
  iVar4 = cbs_get_two_digits(&copy,&hour);
  if (0x17 < hour || iVar4 == 0) {
    return 0;
  }
  iVar4 = cbs_get_two_digits(&copy,&min);
  if (0x3b < min || iVar4 == 0) {
    return 0;
  }
  iVar4 = cbs_get_two_digits(&copy,&sec);
  if (0x3b < sec || iVar4 == 0) {
    return 0;
  }
  if (copy.len == 0) {
    return 0;
  }
  puVar1 = copy.data + 1;
  copy.len = copy.len - 1;
  uVar2 = *copy.data;
  iVar4 = 0;
  copy.data = puVar1;
  if (uVar2 == '+') {
    iVar3 = 1;
  }
  else {
    iVar3 = 0;
    if (uVar2 == 'Z') goto LAB_001614d8;
    if (uVar2 != '-') {
      return 0;
    }
    iVar3 = -1;
  }
  if (allow_timezone_offset == 0) {
    return 0;
  }
  iVar5 = cbs_get_two_digits(&copy,&offset_hours);
  if (0x17 < offset_hours || iVar5 == 0) {
    return 0;
  }
  iVar5 = cbs_get_two_digits(&copy,&offset_minutes);
  if (0x3b < offset_minutes || iVar5 == 0) {
    return 0;
  }
  iVar3 = (offset_minutes * 0x3c + offset_hours * 0xe10) * iVar3;
LAB_001614d8:
  if (copy.len == 0) {
    if (out_tm != (tm *)0x0) {
      out_tm->tm_year = uVar6 - 0x76c;
      out_tm->tm_mon = month + -1;
      out_tm->tm_mday = day;
      out_tm->tm_hour = hour;
      out_tm->tm_min = min;
      out_tm->tm_sec = sec;
      if ((iVar3 != 0) && (iVar4 = OPENSSL_gmtime_adj(out_tm,0,(long)iVar3), iVar4 == 0)) {
        return 0;
      }
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int CBS_parse_rfc5280_time_internal(const CBS *cbs, int is_gentime,
                                           int allow_timezone_offset,
                                           struct tm *out_tm) {
  int year, month, day, hour, min, sec, tmp;
  CBS copy = *cbs;
  uint8_t tz;

  if (is_gentime) {
    if (!cbs_get_two_digits(&copy, &tmp)) {
      return 0;
    }
    year = tmp * 100;
    if (!cbs_get_two_digits(&copy, &tmp)) {
      return 0;
    }
    year += tmp;
  } else {
    year = 1900;
    if (!cbs_get_two_digits(&copy, &tmp)) {
      return 0;
    }
    year += tmp;
    if (year < 1950) {
      year += 100;
    }
    if (year >= 2050) {
      return 0;  // A Generalized time must be used.
    }
  }
  if (!cbs_get_two_digits(&copy, &month) || month < 1 ||
      month > 12 ||  // Reject invalid months.
      !cbs_get_two_digits(&copy, &day) ||
      !is_valid_day(year, month, day) ||  // Reject invalid days.
      !cbs_get_two_digits(&copy, &hour) ||
      hour > 23 ||  // Reject invalid hours.
      !cbs_get_two_digits(&copy, &min) ||
      min > 59 ||  // Reject invalid minutes.
      !cbs_get_two_digits(&copy, &sec) || sec > 59 || !CBS_get_u8(&copy, &tz)) {
    return 0;
  }

  int offset_sign = 0;
  switch (tz) {
    case 'Z':
      break;  // We correctly have 'Z' on the end as per spec.
    case '+':
      offset_sign = 1;
      break;  // Should not be allowed per RFC 5280.
    case '-':
      offset_sign = -1;
      break;  // Should not be allowed per RFC 5280.
    default:
      return 0;  // Reject anything else after the time.
  }

  // If allow_timezone_offset is non-zero, allow for a four digit timezone
  // offset to be specified even though this is not allowed by RFC 5280. We are
  // permissive of this for UTCTimes due to the unfortunate existence of
  // artisinally rolled long lived certificates that were baked into places that
  // are now difficult to change. These certificates were generated with the
  // 'openssl' command that permissively allowed the creation of certificates
  // with notBefore and notAfter times specified as strings for direct
  // certificate inclusion on the command line. For context see cl/237068815.
  //
  // TODO(bbe): This has been expunged from public web-pki as the ecosystem has
  // managed to encourage CA compliance with standards. We should find a way to
  // get rid of this or make it off by default.
  int offset_seconds = 0;
  if (offset_sign != 0) {
    if (!allow_timezone_offset) {
      return 0;
    }
    int offset_hours, offset_minutes;
    if (!cbs_get_two_digits(&copy, &offset_hours) ||
        offset_hours > 23 ||  // Reject invalid hours.
        !cbs_get_two_digits(&copy, &offset_minutes) ||
        offset_minutes > 59) {  // Reject invalid minutes.
      return 0;
    }
    offset_seconds = offset_sign * (offset_hours * 3600 + offset_minutes * 60);
  }

  if (CBS_len(&copy) != 0) {
    return 0;  // Reject invalid lengths.
  }

  if (out_tm != NULL) {
    // Fill in the tm fields corresponding to what we validated.
    out_tm->tm_year = year - 1900;
    out_tm->tm_mon = month - 1;
    out_tm->tm_mday = day;
    out_tm->tm_hour = hour;
    out_tm->tm_min = min;
    out_tm->tm_sec = sec;
    if (offset_seconds && !OPENSSL_gmtime_adj(out_tm, 0, offset_seconds)) {
      return 0;
    }
  }
  return 1;
}